

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::date_t,duckdb::timestamp_t,duckdb::BinaryStandardOperatorWrapper,duckdb::DateTruncBinaryOperator,bool,true,false>
               (string_t *ldata,date_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  string_t left;
  string_t left_00;
  bool bVar1;
  timestamp_t tVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  anon_union_16_2_67f50693_for_value *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  date_t rentry_2;
  string_t lentry_2;
  idx_t i;
  date_t rentry_1;
  string_t lentry_1;
  idx_t start;
  date_t rentry;
  string_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_fffffffffffffef0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffef8;
  timestamp_t in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff0b;
  date_t in_stack_ffffffffffffff0c;
  undefined8 in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  ulong local_e0;
  idx_t local_a0;
  unsigned_long local_98;
  undefined4 local_8c;
  undefined8 local_88;
  char *local_80;
  int64_t local_78;
  undefined4 local_6c;
  undefined8 local_68;
  char *local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  void *local_10;
  anon_union_16_2_67f50693_for_value *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + in_RCX * 4),in_RDX,(void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (local_e0 = 0; local_e0 < local_20; local_e0 = local_e0 + 1) {
      in_stack_ffffffffffffff00 =
           BinaryStandardOperatorWrapper::
           Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                     ((bool)in_stack_ffffffffffffff0b,(string_t)local_8->pointer,
                      (date_t)*(int32_t *)((long)local_10 + local_e0 * 4),
                      in_stack_ffffffffffffff00.value,(idx_t)(local_8->pointer).ptr);
      *(int64_t *)((long)local_18 + local_e0 * 8) = in_stack_ffffffffffffff00.value;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0xcc2fc9);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_88 = *(undefined8 *)local_8;
          local_80 = (local_8->pointer).ptr;
          local_8c = *(undefined4 *)((long)local_10 + local_38 * 4);
          left.value.pointer.ptr = (char *)in_stack_ffffffffffffff18;
          left.value._0_8_ = in_stack_ffffffffffffff10;
          local_6c = local_8c;
          local_68 = local_88;
          local_60 = local_80;
          local_78 = (int64_t)BinaryStandardOperatorWrapper::
                              Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                                        ((bool)in_stack_ffffffffffffff0b,left,
                                         in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00.value,
                                         (idx_t)in_stack_fffffffffffffef8);
          *(int64_t *)((long)local_18 + local_38 * 8) = local_78;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_98 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_a0 = local_38 - local_98;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_a0);
            if (bVar1) {
              left_00.value.pointer.ptr = (char *)in_stack_ffffffffffffff18;
              left_00.value._0_8_ = in_stack_ffffffffffffff10;
              tVar2 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::DateTruncBinaryOperator,duckdb::string_t,duckdb::date_t,duckdb::timestamp_t>
                                ((bool)in_stack_ffffffffffffff0b,left_00,in_stack_ffffffffffffff0c,
                                 in_stack_ffffffffffffff00.value,(idx_t)in_stack_fffffffffffffef8);
              *(int64_t *)((long)local_18 + local_38 * 8) = tVar2.value;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}